

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opt-parser.h
# Opt level: O0

void ORPG::Core::permute_args(int start,int end,int opt_end,char **argv)

{
  char *pcVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int local_48;
  int local_44;
  int j;
  int i;
  char *swap;
  int pos;
  int nopts;
  int nonopts;
  int cycle;
  int cycle_len;
  int cycle_start;
  char **argv_local;
  int opt_end_local;
  int end_local;
  int start_local;
  
  iVar3 = ORPG::Utils::gcd(end - start,opt_end - end);
  for (local_44 = 0; local_44 < iVar3; local_44 = local_44 + 1) {
    iVar4 = end + local_44;
    swap._0_4_ = iVar4;
    for (local_48 = 0; local_48 < (opt_end - start) / iVar3; local_48 = local_48 + 1) {
      iVar2 = opt_end - end;
      if (end <= (int)swap) {
        iVar2 = -(end - start);
      }
      swap._0_4_ = (int)swap + iVar2;
      pcVar1 = argv[(int)swap];
      argv[(int)swap] = argv[iVar4];
      argv[iVar4] = pcVar1;
    }
  }
  return;
}

Assistant:

static void permute_args(int start,
                                int end,
                                int opt_end,
                                char* argv[])
        {
            int cycle_start, cycle_len, cycle, nonopts, nopts, pos;
            char *swap;

            /* compute lengths of array blocks, number, size of cycles */
            nonopts = end - start;
            nopts = opt_end - end;
            cycle = ORPG::Utils::gcd(nonopts, nopts);
            cycle_len = (opt_end - start) / cycle;

            for (int i = 0; i < cycle; i++) {
                cycle_start = end + i;
                pos = cycle_start;

                for (int j = 0; j < cycle_len; j++) {
                    if (pos >= end) pos -= nonopts;
                    else            pos += nopts;

                    swap = argv[pos];
                    /* linted const cast */
                    ((char **)argv)[pos] = argv[cycle_start];

                    /* linted const cast */
                    ((char **)argv)[cycle_start] = swap;
                }
            }
        }